

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Radio_Communications_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Radio_Communications_Header *this)

{
  ostream *poVar1;
  char cVar2;
  ulong uVar3;
  KString local_380;
  string local_360 [32];
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_380,&this->m_EntityID);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xffff;
    if (local_380._M_string_length <= uVar3) break;
    cVar2 = local_380._M_dataplus._M_p[uVar3];
    if (local_380._M_string_length - 1 != uVar3 && cVar2 == '\n') {
      cVar2 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar2);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  poVar1 = std::operator<<(poVar1,local_360);
  poVar1 = std::operator<<(poVar1,"Radio ID:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16RadioID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Radio_Communications_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Radio ID:        " << m_ui16RadioID << "\n";

    return ss.str();
}